

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O0

void gf_25519_mul(gf_25519_s *cs,gf_25519_s *as,gf_25519_s *bs)

{
  __uint128_t *p_Var1;
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t *in_RDX;
  uint64_t *b_00;
  uint64_t *b_01;
  long extraout_RDX;
  uint64_t *b_02;
  long extraout_RDX_00;
  undefined8 *in_RSI;
  ulong *in_RDI;
  bool bVar6;
  uint64_t a1;
  uint64_t c1;
  uint64_t c0;
  uint64_t ai;
  __uint128_t accum2;
  __uint128_t accum1;
  __uint128_t accum0;
  uint64_t *c;
  uint64_t mask;
  uint64_t *b;
  uint64_t *a;
  undefined8 in_stack_fffffffffffffe98;
  __uint128_t **acc;
  __uint128_t *local_68;
  long local_60;
  __uint128_t *local_58;
  uint64_t *local_50;
  __uint128_t *local_48;
  undefined8 local_40;
  ulong *local_38;
  undefined8 local_30;
  uint64_t *local_28;
  undefined8 *local_20;
  
  local_30 = 0x7ffffffffffff;
  p_Var1 = (__uint128_t *)*in_RSI;
  local_38 = in_RDI;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_48 = widemul_rm(p_Var1,(uint64_t)in_RDX,in_RDX);
  local_58 = widemul_rm(p_Var1,(uint64_t)(local_28 + 1),b_00);
  local_50 = b_01;
  local_68 = widemul_rm(p_Var1,(uint64_t)(local_28 + 2),b_01);
  uVar5 = local_20[1];
  acc = &local_68;
  local_60 = extraout_RDX;
  mac_rm((__uint128_t *)acc,uVar5,local_28 + 1);
  mac_rm((__uint128_t *)&local_58,uVar5,local_28);
  mac_rm((__uint128_t *)&local_48,uVar5 * 0x13,local_28 + 4);
  uVar5 = local_20[2];
  mac_rm((__uint128_t *)acc,uVar5,local_28);
  uVar5 = uVar5 * 0x13;
  mac_rm((__uint128_t *)&local_48,uVar5,local_28 + 3);
  mac_rm((__uint128_t *)&local_58,uVar5,local_28 + 4);
  uVar5 = local_20[3] * 0x13;
  mac_rm((__uint128_t *)&local_48,uVar5,local_28 + 2);
  mac_rm((__uint128_t *)&local_58,uVar5,local_28 + 3);
  mac_rm((__uint128_t *)acc,uVar5,local_28 + 4);
  uVar5 = local_20[4] * 0x13;
  mac_rm((__uint128_t *)&local_48,uVar5,local_28 + 1);
  mac_rm((__uint128_t *)&local_58,uVar5,local_28 + 2);
  mac_rm((__uint128_t *)acc,uVar5,local_28 + 3);
  uVar2 = (ulong)local_48 & 0x7ffffffffffff;
  x._8_8_ = acc;
  x._0_8_ = in_stack_fffffffffffffe98;
  uVar3 = shrld((__uint128_t)x,(int)local_48);
  bVar6 = CARRY8((ulong)local_58,uVar3);
  local_58 = (__uint128_t *)((long)local_58 + uVar3);
  local_50 = (uint64_t *)((long)local_50 + (ulong)bVar6);
  uVar4 = (ulong)local_58 & 0x7ffffffffffff;
  x_00._8_8_ = acc;
  x_00._0_8_ = in_stack_fffffffffffffe98;
  uVar3 = shrld((__uint128_t)x_00,(int)local_58);
  bVar6 = CARRY8((ulong)local_68,uVar3);
  local_68 = (__uint128_t *)((long)local_68 + uVar3);
  local_60 = local_60 + (ulong)bVar6;
  local_38[2] = (ulong)local_68 & 0x7ffffffffffff;
  x_01._8_8_ = acc;
  x_01._0_8_ = in_stack_fffffffffffffe98;
  local_48 = (__uint128_t *)shrld((__uint128_t)x_01,(int)local_68);
  local_40 = 0;
  mac_rm((__uint128_t *)&local_48,uVar5,local_28 + 4);
  p_Var1 = (__uint128_t *)*local_20;
  mac_rm((__uint128_t *)&local_48,(uint64_t)p_Var1,local_28 + 3);
  local_58 = widemul_rm(p_Var1,(uint64_t)(local_28 + 4),b_02);
  uVar5 = local_20[1];
  local_50 = (uint64_t *)extraout_RDX_00;
  mac_rm((__uint128_t *)&local_48,uVar5,local_28 + 2);
  mac_rm((__uint128_t *)&local_58,uVar5,local_28 + 3);
  uVar5 = local_20[2];
  mac_rm((__uint128_t *)&local_48,uVar5,local_28 + 1);
  mac_rm((__uint128_t *)&local_58,uVar5,local_28 + 2);
  uVar5 = local_20[3];
  mac_rm((__uint128_t *)&local_48,uVar5,local_28);
  mac_rm((__uint128_t *)&local_58,uVar5,local_28 + 1);
  mac_rm((__uint128_t *)&local_58,local_20[4],local_28);
  local_38[3] = (ulong)local_48 & 0x7ffffffffffff;
  x_02._8_8_ = acc;
  x_02._0_8_ = in_stack_fffffffffffffe98;
  uVar5 = shrld((__uint128_t)x_02,(int)local_48);
  bVar6 = CARRY8((ulong)local_58,uVar5);
  local_58 = (__uint128_t *)((long)local_58 + uVar5);
  local_50 = (uint64_t *)((long)local_50 + (ulong)bVar6);
  local_38[4] = (ulong)local_58 & 0x7ffffffffffff;
  x_03._8_8_ = acc;
  x_03._0_8_ = in_stack_fffffffffffffe98;
  uVar5 = shrld((__uint128_t)x_03,(int)local_58);
  uVar2 = uVar5 * 0x13 + uVar2;
  *local_38 = uVar2 & 0x7ffffffffffff;
  local_38[1] = uVar4 + (uVar2 >> 0x33);
  return;
}

Assistant:

void gf_mul (gf_s *__restrict__ cs, const gf as, const gf bs) {
    const uint64_t *a = as->limb, *b = bs->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;
    
    __uint128_t accum0, accum1, accum2;
    
    uint64_t ai = a[0];
    accum0 = widemul_rm(ai, &b[0]);
    accum1 = widemul_rm(ai, &b[1]);
    accum2 = widemul_rm(ai, &b[2]);
    
    ai = a[1];
    mac_rm(&accum2, ai, &b[1]);
    mac_rm(&accum1, ai, &b[0]);
    ai *= 19;
    mac_rm(&accum0, ai, &b[4]);
    
    ai = a[2];
    mac_rm(&accum2, ai, &b[0]);
    ai *= 19;
    mac_rm(&accum0, ai, &b[3]);
    mac_rm(&accum1, ai, &b[4]);
    
    ai = a[3] * 19;
    mac_rm(&accum0, ai, &b[2]);
    mac_rm(&accum1, ai, &b[3]);
    mac_rm(&accum2, ai, &b[4]);
    
    ai = a[4] * 19;
    mac_rm(&accum0, ai, &b[1]);
    mac_rm(&accum1, ai, &b[2]);
    mac_rm(&accum2, ai, &b[3]);
    
    uint64_t c0 = accum0 & mask;
    accum1 += shrld(accum0, 51);
    uint64_t c1 = accum1 & mask;
    accum2 += shrld(accum1, 51);
    c[2] = accum2 & mask;
    
    accum0 = shrld(accum2, 51);

    mac_rm(&accum0, ai, &b[4]);
    
    ai = a[0];
    mac_rm(&accum0, ai, &b[3]);
    accum1 = widemul_rm(ai, &b[4]);
    
    ai = a[1];
    mac_rm(&accum0, ai, &b[2]);
    mac_rm(&accum1, ai, &b[3]);
    
    ai = a[2];
    mac_rm(&accum0, ai, &b[1]);
    mac_rm(&accum1, ai, &b[2]);
    
    ai = a[3];
    mac_rm(&accum0, ai, &b[0]);
    mac_rm(&accum1, ai, &b[1]);
    
    ai = a[4];
    mac_rm(&accum1, ai, &b[0]);
    /* Here accum1 < 5*(9*2^51)^2 */
    
    c[3] = accum0 & mask;
    accum1 += shrld(accum0, 51);
    c[4] = accum1 & mask;
    
    uint64_t a1 = shrld(accum1,51);
    /* Here a1 < (5*(9*2^51)^2 + small) >> 51 = 405 * 2^51 + small
     * a1 * 19 + c0 < (405*19+1)*2^51 + small < 2^13 * 2^51.
     */
    accum1 = a1 * 19 + c0;
    c[0] = accum1 & mask;
    c[1] = c1 + (accum1>>51);
}